

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer *
helics::typeConvert(DataType type,
                   vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  initializer_list_t init;
  string_view valname;
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference other;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDX;
  uint in_ESI;
  SmallBuffer *in_RDI;
  complex<double> *element;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3_1;
  json jsonArray;
  json json;
  complex<double> *vali;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  vector<double,_std::allocator<double>_> vectorVal;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  NamedPoint *in_stack_fffffffffffffd98;
  SmallBuffer *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdc8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffdd0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdd8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffde0;
  undefined1 local_1c8 [40];
  double local_1a0;
  undefined1 local_198 [24];
  complex<double> *local_180;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_178 [2];
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_168 [4];
  double local_128;
  double local_120;
  reference local_118;
  complex<double> *local_110;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_108 [8];
  DataType in_stack_ffffffffffffff38;
  DataType in_stack_ffffffffffffff3c;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  DataType type_00;
  
  type_00 = (DataType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     in_stack_fffffffffffffd90);
  if (bVar1) {
    emptyBlock(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  }
  else {
    sVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (in_RDX);
    if (sVar2 == 1) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)in_RDX,0);
      typeConvert(type_00,(complex<double> *)in_stack_ffffffffffffffd0.internalTimeCode);
    }
    else {
      uVar3 = (ulong)in_ESI;
      switch(uVar3) {
      case 0:
      case 9:
        helicsComplexVectorString_abi_cxx11_(in_stack_fffffffffffffdd0);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd80);
        ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
        break;
      case 1:
        vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffd90);
        ValueConverter<double>::convert((double *)in_stack_fffffffffffffd98);
        break;
      case 2:
        vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffd90);
        ValueConverter<long>::convert((long *)in_stack_fffffffffffffd98);
        break;
      case 3:
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)in_RDX,0)
        ;
        ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffd98)
        ;
        break;
      case 4:
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x3278b5);
        CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size(in_RDX)
        ;
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        local_108[0]._M_current =
             (complex<double> *)
             CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                       (in_stack_fffffffffffffd78);
        local_110 = (complex<double> *)
                    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                    end(in_stack_fffffffffffffd78);
        while (bVar1 = __gnu_cxx::
                       operator==<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                 ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                   *)in_stack_fffffffffffffd80,
                                  (__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                   *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_118 = __gnu_cxx::
                      __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                      ::operator*(local_108);
          local_120 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_118);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                     (value_type_conflict3 *)in_stack_fffffffffffffd78);
          local_128 = std::complex<double>::imag_abi_cxx11_((complex<double> *)local_118);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                     (value_type_conflict3 *)in_stack_fffffffffffffd78);
          __gnu_cxx::
          __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
          ::operator++(local_108);
        }
        ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd98);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90);
        break;
      case 5:
      default:
        ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
        convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                in_stack_fffffffffffffd98);
        break;
      case 6:
        helicsComplexVectorString_abi_cxx11_(in_stack_fffffffffffffdd0);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd80);
        nan("0");
        valname._M_str = (char *)in_stack_fffffffffffffdb0;
        valname._M_len = in_stack_fffffffffffffda8;
        NamedPoint::NamedPoint
                  ((NamedPoint *)in_stack_fffffffffffffda0,valname,(double)in_stack_fffffffffffffd98
                  );
        ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffd98);
        NamedPoint::~NamedPoint((NamedPoint *)0x32782c);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
        break;
      case 7:
        vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffd90);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
        ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd98);
        break;
      case 8:
        vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffd90);
        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd80,
                   (double)in_stack_fffffffffffffd78);
        TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                  ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffd0);
        ValueConverter<long>::convert((long *)in_stack_fffffffffffffd98);
        break;
      case 0x1e:
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        typeNameStringRef_abi_cxx11_((DataType)(uVar3 >> 0x20));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd98);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffd80);
        std::
        initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::initializer_list(local_168);
        init._M_len = (size_type)in_stack_fffffffffffffd98;
        init._M_array = (iterator)in_stack_fffffffffffffd90;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::array(init);
        local_178[0]._M_current =
             (complex<double> *)
             CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                       (in_stack_fffffffffffffd78);
        local_180 = (complex<double> *)
                    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                    end(in_stack_fffffffffffffd78);
        while (bVar1 = __gnu_cxx::
                       operator==<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                 ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                   *)in_stack_fffffffffffffd80,
                                  (__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                   *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_198._16_8_ =
               __gnu_cxx::
               __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator*(local_178);
          local_1a0 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_198._16_8_);
          in_stack_fffffffffffffda0 = (SmallBuffer *)local_198;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<double,_double,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd80,(double *)in_stack_fffffffffffffd78);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffd80);
          in_stack_fffffffffffffd98 =
               (NamedPoint *)
               std::complex<double>::imag_abi_cxx11_((complex<double> *)local_198._16_8_);
          in_stack_fffffffffffffd90 =
               (basic_string_view<char,_std::char_traits<char>_> *)(local_1c8 + 0x18);
          local_1c8._16_8_ = in_stack_fffffffffffffd98;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<double,_double,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd80,(double *)in_stack_fffffffffffffd78);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffd80);
          __gnu_cxx::
          __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
          ::operator++(local_178);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        other = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffd90,other);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this);
        fileops::generateJsonString(other,SUB81((ulong)this >> 0x38,0));
        SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                  (in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->name);
        std::__cxx11::string::~string(this);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this);
      }
    }
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvert(DataType type, const std::vector<std::complex<double>>& val)
{
    if (val.empty()) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (val.size() == 1) {
        return typeConvert(type, val[0]);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(val));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(val)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(
                static_cast<int64_t>(vectorNorm(val)));  // NOLINT
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(val[0]);
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(val) != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsComplexVectorString(val), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
        default:
            return ValueConverter<std::vector<std::complex<double>>>::convert(val);
        case DataType::HELICS_VECTOR: {
            std::vector<double> vectorVal;
            vectorVal.reserve(val.size() * 2);
            for (const auto& vali : val) {
                vectorVal.push_back(vali.real());
                vectorVal.push_back(vali.imag());
            }
            return ValueConverter<std::vector<double>>::convert(vectorVal);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_COMPLEX_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (const auto& element : val) {
                jsonArray.push_back(element.real());
                jsonArray.push_back(element.imag());
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}